

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.cpp
# Opt level: O0

MidiEvent * __thiscall smf::MidiEvent::operator=(MidiEvent *this,MidiMessage *message)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  int local_24;
  int i;
  MidiMessage *message_local;
  MidiEvent *this_local;
  
  if (this != (MidiEvent *)message) {
    clearVariables(this);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (&message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,sVar2);
    for (local_24 = 0;
        sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this),
        local_24 < (int)sVar2; local_24 = local_24 + 1) {
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                          (long)local_24);
      vVar1 = *pvVar3;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
                          (long)local_24);
      *pvVar4 = vVar1;
    }
  }
  return this;
}

Assistant:

MidiEvent& MidiEvent::operator=(const MidiMessage& message) {
	if (this == &message) {
		return *this;
	}
	clearVariables();
	this->resize(message.size());
	for (int i=0; i<(int)this->size(); i++) {
		(*this)[i] = message[i];
	}
	return *this;
}